

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  ImDrawCmd *__src;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  long lVar6;
  ImVec4 *pIVar7;
  ImDrawCmd *__dest;
  int iVar8;
  int iVar9;
  void *pvVar10;
  
  lVar6 = (long)(this->_ClipRectStack).Size;
  pIVar7 = (this->_ClipRectStack).Data + lVar6 + -1;
  if (lVar6 == 0) {
    pIVar7 = &this->_Data->ClipRectFullscreen;
  }
  fVar1 = pIVar7->x;
  fVar2 = pIVar7->y;
  fVar3 = pIVar7->z;
  fVar4 = pIVar7->w;
  lVar6 = (long)(this->_TextureIdStack).Size;
  if (lVar6 == 0) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = (this->_TextureIdStack).Data[lVar6 + -1];
  }
  if ((fVar1 <= fVar3) && (fVar2 <= fVar4)) {
    iVar5 = (this->CmdBuffer).Size;
    if (iVar5 == (this->CmdBuffer).Capacity) {
      if (iVar5 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar5 / 2 + iVar5;
      }
      iVar9 = iVar5 + 1;
      if (iVar5 + 1 < iVar8) {
        iVar9 = iVar8;
      }
      __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar9 * 0x30);
      __src = (this->CmdBuffer).Data;
      if (__src != (ImDrawCmd *)0x0) {
        memcpy(__dest,__src,(long)(this->CmdBuffer).Size * 0x30);
        ImGui::MemFree((this->CmdBuffer).Data);
      }
      (this->CmdBuffer).Data = __dest;
      (this->CmdBuffer).Capacity = iVar9;
      iVar5 = (this->CmdBuffer).Size;
    }
    else {
      __dest = (this->CmdBuffer).Data;
    }
    __dest[iVar5].ElemCount = 0;
    pIVar7 = &__dest[iVar5].ClipRect;
    pIVar7->x = fVar1;
    pIVar7->y = fVar2;
    pIVar7->z = fVar3;
    pIVar7->w = fVar4;
    __dest[iVar5].TextureId = pvVar10;
    __dest[iVar5].UserCallback = (ImDrawCallback)0x0;
    (&__dest[iVar5].UserCallback)[1] = (ImDrawCallback)0x0;
    (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_draw.cpp"
                ,0x1a3,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}